

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::ClearField(Reflection *this,Message *message,FieldDescriptor *field)

{
  ReflectionSchema *this_00;
  uint *puVar1;
  int32_t iVar2;
  byte bVar3;
  ulong uVar4;
  pointer pcVar5;
  size_type sVar6;
  Descriptor *expected;
  int iVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  CppStringType CVar10;
  LongSooRep *pLVar11;
  MapFieldBase *this_01;
  RepeatedField<absl::lts_20250127::Cord> *this_02;
  RepeatedPtrFieldBase *pRVar12;
  anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *paVar13;
  undefined8 *puVar14;
  EnumValueDescriptor *pEVar15;
  int *piVar16;
  int32_t *piVar17;
  undefined1 *puVar18;
  Cord *pCVar19;
  ArenaStringPtr *this_03;
  Nonnull<const_char_*> pcVar20;
  bool bVar21;
  anon_union_8_10_579a0ab3_for_FieldDescriptor_27 aVar22;
  Metadata MVar23;
  string_view src;
  
  MVar23 = Message::GetMetadata(message);
  if (MVar23.reflection != this) goto LAB_00f9a67f;
  if (field->containing_type_ != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"ClearField","Field does not match message type.");
  }
  bVar3 = field->field_0x1;
  if ((bVar3 & 8) != 0) {
    uVar8 = protobuf::internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    protobuf::internal::ExtensionSet::ClearExtension
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar8),field->number_
              );
    return;
  }
  bVar21 = (bool)((bVar3 & 0x20) >> 5);
  if (0xbf < bVar3 == bVar21) {
    pcVar20 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar20 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                        (bVar21,0xbf < bVar3,
                         "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar20 != (Nonnull<const_char_*>)0x0) {
    ClearField();
  }
  if ((field->field_0x1 & 0x20) != 0) {
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
    case 1:
    case 8:
      VerifyFieldType<google::protobuf::RepeatedField<int>>(this,field);
      pLVar11 = (LongSooRep *)MutableRawImpl(this,message,field);
      uVar4 = pLVar11->elements_int;
      if ((uVar4 & 4) != 0) {
        protobuf::internal::LongSooRep::elements(pLVar11);
      }
      bVar21 = (uVar4 & 4) == 0;
      protobuf::internal::SooRep::size((SooRep *)pLVar11,bVar21);
      iVar7 = protobuf::internal::SooRep::size((SooRep *)pLVar11,bVar21);
      if ((iVar7 != 0) && ((pLVar11->elements_int & 4) != 0)) {
        protobuf::internal::LongSooRep::elements(pLVar11);
      }
      RepeatedField<int>::set_size((RepeatedField<int> *)pLVar11,(uVar4 & 4) == 0,0);
      return;
    case 2:
      VerifyFieldType<google::protobuf::RepeatedField<long>>(this,field);
      pLVar11 = (LongSooRep *)MutableRawImpl(this,message,field);
      uVar4 = pLVar11->elements_int;
      if ((uVar4 & 4) != 0) {
        protobuf::internal::LongSooRep::elements(pLVar11);
      }
      bVar21 = (uVar4 & 4) == 0;
      protobuf::internal::SooRep::size((SooRep *)pLVar11,bVar21);
      iVar7 = protobuf::internal::SooRep::size((SooRep *)pLVar11,bVar21);
      if ((iVar7 != 0) && ((pLVar11->elements_int & 4) != 0)) {
        protobuf::internal::LongSooRep::elements(pLVar11);
      }
      RepeatedField<long>::set_size((RepeatedField<long> *)pLVar11,(uVar4 & 4) == 0,0);
      return;
    case 3:
      VerifyFieldType<google::protobuf::RepeatedField<unsigned_int>>(this,field);
      pLVar11 = (LongSooRep *)MutableRawImpl(this,message,field);
      uVar4 = pLVar11->elements_int;
      if ((uVar4 & 4) != 0) {
        protobuf::internal::LongSooRep::elements(pLVar11);
      }
      bVar21 = (uVar4 & 4) == 0;
      protobuf::internal::SooRep::size((SooRep *)pLVar11,bVar21);
      iVar7 = protobuf::internal::SooRep::size((SooRep *)pLVar11,bVar21);
      if ((iVar7 != 0) && ((pLVar11->elements_int & 4) != 0)) {
        protobuf::internal::LongSooRep::elements(pLVar11);
      }
      RepeatedField<unsigned_int>::set_size
                ((RepeatedField<unsigned_int> *)pLVar11,(uVar4 & 4) == 0,0);
      return;
    case 4:
      VerifyFieldType<google::protobuf::RepeatedField<unsigned_long>>(this,field);
      pLVar11 = (LongSooRep *)MutableRawImpl(this,message,field);
      uVar4 = pLVar11->elements_int;
      if ((uVar4 & 4) != 0) {
        protobuf::internal::LongSooRep::elements(pLVar11);
      }
      bVar21 = (uVar4 & 4) == 0;
      protobuf::internal::SooRep::size((SooRep *)pLVar11,bVar21);
      iVar7 = protobuf::internal::SooRep::size((SooRep *)pLVar11,bVar21);
      if ((iVar7 != 0) && ((pLVar11->elements_int & 4) != 0)) {
        protobuf::internal::LongSooRep::elements(pLVar11);
      }
      RepeatedField<unsigned_long>::set_size
                ((RepeatedField<unsigned_long> *)pLVar11,(uVar4 & 4) == 0,0);
      return;
    case 5:
      VerifyFieldType<google::protobuf::RepeatedField<double>>(this,field);
      pLVar11 = (LongSooRep *)MutableRawImpl(this,message,field);
      uVar4 = pLVar11->elements_int;
      if ((uVar4 & 4) != 0) {
        protobuf::internal::LongSooRep::elements(pLVar11);
      }
      bVar21 = (uVar4 & 4) == 0;
      protobuf::internal::SooRep::size((SooRep *)pLVar11,bVar21);
      iVar7 = protobuf::internal::SooRep::size((SooRep *)pLVar11,bVar21);
      if ((iVar7 != 0) && ((pLVar11->elements_int & 4) != 0)) {
        protobuf::internal::LongSooRep::elements(pLVar11);
      }
      RepeatedField<double>::set_size((RepeatedField<double> *)pLVar11,(uVar4 & 4) == 0,0);
      return;
    case 6:
      VerifyFieldType<google::protobuf::RepeatedField<float>>(this,field);
      pLVar11 = (LongSooRep *)MutableRawImpl(this,message,field);
      uVar4 = pLVar11->elements_int;
      if ((uVar4 & 4) != 0) {
        protobuf::internal::LongSooRep::elements(pLVar11);
      }
      bVar21 = (uVar4 & 4) == 0;
      protobuf::internal::SooRep::size((SooRep *)pLVar11,bVar21);
      iVar7 = protobuf::internal::SooRep::size((SooRep *)pLVar11,bVar21);
      if ((iVar7 != 0) && ((pLVar11->elements_int & 4) != 0)) {
        protobuf::internal::LongSooRep::elements(pLVar11);
      }
      RepeatedField<float>::set_size((RepeatedField<float> *)pLVar11,(uVar4 & 4) == 0,0);
      return;
    case 7:
      VerifyFieldType<google::protobuf::RepeatedField<bool>>(this,field);
      pLVar11 = (LongSooRep *)MutableRawImpl(this,message,field);
      uVar4 = pLVar11->elements_int;
      if ((uVar4 & 4) != 0) {
        protobuf::internal::LongSooRep::elements(pLVar11);
      }
      bVar21 = (uVar4 & 4) == 0;
      protobuf::internal::SooRep::size((SooRep *)pLVar11,bVar21);
      iVar7 = protobuf::internal::SooRep::size((SooRep *)pLVar11,bVar21);
      if ((iVar7 != 0) && ((pLVar11->elements_int & 4) != 0)) {
        protobuf::internal::LongSooRep::elements(pLVar11);
      }
      RepeatedField<bool>::set_size((RepeatedField<bool> *)pLVar11,(uVar4 & 4) == 0,0);
      return;
    case 9:
      goto switchD_00f99f36_caseD_9;
    case 10:
      if ((field->type_ == 0xb) && (bVar21 = FieldDescriptor::is_map_message_type(field), bVar21)) {
        VerifyFieldType<google::protobuf::internal::MapFieldBase>(this,field);
        this_01 = (MapFieldBase *)MutableRawImpl(this,message,field);
        protobuf::internal::MapFieldBase::Clear(this_01);
        return;
      }
      VerifyFieldType<google::protobuf::internal::RepeatedPtrFieldBase>(this,field);
      pRVar12 = (RepeatedPtrFieldBase *)MutableRawImpl(this,message,field);
      protobuf::internal::RepeatedPtrFieldBase::
      Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>(pRVar12);
      return;
    default:
      return;
    }
  }
  this_00 = &this->schema_;
  bVar21 = protobuf::internal::ReflectionSchema::InRealOneof(this_00,field);
  if (bVar21) {
    ClearOneofField(this,message,field);
    return;
  }
  bVar21 = HasFieldSingular(this,message,field);
  if (!bVar21) {
    return;
  }
  if ((field->options_->field_0)._impl_.weak_ == true) {
    ClearField();
LAB_00f9a675:
    ClearField();
LAB_00f9a67f:
    expected = this->descriptor_;
    MVar23 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(expected,MVar23.descriptor,field,"ClearField")
    ;
  }
  uVar8 = protobuf::internal::ReflectionSchema::HasBitIndex(this_00,field);
  if (uVar8 != 0xffffffff) {
    if ((this->schema_).has_bits_offset_ == -1) goto LAB_00f9a675;
    bVar3 = (byte)uVar8 & 0x1f;
    uVar9 = protobuf::internal::ReflectionSchema::HasBitsOffset(this_00);
    puVar1 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                     (ulong)(uVar8 >> 5) * 4 + (ulong)uVar9);
    *puVar1 = *puVar1 & (-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
  case 1:
    iVar7 = (field->field_20).default_value_int32_t_;
    goto LAB_00f9a4bb;
  case 2:
    aVar22 = field->field_20;
    VerifyFieldType<long>(this,field);
    goto LAB_00f9a4e7;
  case 3:
    iVar7 = (field->field_20).default_value_int32_t_;
    VerifyFieldType<unsigned_int>(this,field);
    goto LAB_00f9a4c6;
  case 4:
    aVar22 = field->field_20;
    VerifyFieldType<unsigned_long>(this,field);
LAB_00f9a4e7:
    paVar13 = (anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)MutableRawImpl(this,message,field);
    *paVar13 = aVar22;
    break;
  case 5:
    aVar22 = field->field_20;
    VerifyFieldType<double>(this,field);
    paVar13 = (anon_union_8_10_579a0ab3_for_FieldDescriptor_27 *)MutableRawImpl(this,message,field);
    *paVar13 = aVar22;
    break;
  case 6:
    iVar2 = (field->field_20).default_value_int32_t_;
    VerifyFieldType<float>(this,field);
    piVar17 = (int32_t *)MutableRawImpl(this,message,field);
    *piVar17 = iVar2;
    break;
  case 7:
    bVar21 = (field->field_20).default_value_bool_;
    VerifyFieldType<bool>(this,field);
    puVar18 = (undefined1 *)MutableRawImpl(this,message,field);
    *puVar18 = bVar21;
    break;
  case 8:
    pEVar15 = FieldDescriptor::default_value_enum(field);
    iVar7 = pEVar15->number_;
LAB_00f9a4bb:
    VerifyFieldType<int>(this,field);
LAB_00f9a4c6:
    piVar16 = (int *)MutableRawImpl(this,message,field);
    *piVar16 = iVar7;
    break;
  case 9:
    CVar10 = FieldDescriptor::cpp_string_type(field);
    if ((CVar10 == kView) || (CVar10 == kString)) {
      bVar21 = protobuf::internal::ReflectionSchema::IsFieldInlined(this_00,field);
      if (bVar21) {
        VerifyFieldType<google::protobuf::internal::InlinedStringField>(this,field);
        puVar14 = (undefined8 *)MutableRawImpl(this,message,field);
        puVar14[1] = 0;
        *(undefined1 *)*puVar14 = 0;
      }
      else {
        VerifyFieldType<google::protobuf::internal::ArenaStringPtr>(this,field);
        this_03 = (ArenaStringPtr *)MutableRawImpl(this,message,field);
        protobuf::internal::ArenaStringPtr::Destroy(this_03);
        (this_03->tagged_ptr_).ptr_ = &protobuf::internal::fixed_address_empty_string;
      }
    }
    else if (CVar10 == kCord) {
      if ((field->field_0x1 & 1) != 0) {
        pcVar5 = (((field->field_20).default_value_string_)->_M_dataplus)._M_p;
        sVar6 = ((field->field_20).default_value_string_)->_M_string_length;
        VerifyFieldType<absl::lts_20250127::Cord>(this,field);
        pCVar19 = (Cord *)MutableRawImpl(this,message,field);
        src._M_str = pcVar5;
        src._M_len = sVar6;
        absl::lts_20250127::Cord::operator=(pCVar19,src);
        return;
      }
      VerifyFieldType<absl::lts_20250127::Cord>(this,field);
      pCVar19 = (Cord *)MutableRawImpl(this,message,field);
      absl::lts_20250127::Cord::Clear(pCVar19);
      return;
    }
    break;
  case 10:
    VerifyFieldType<google::protobuf::Message*>(this,field);
    puVar14 = (undefined8 *)MutableRawImpl(this,message,field);
    (**(code **)(*(long *)*puVar14 + 0x10))();
    return;
  }
  return;
switchD_00f99f36_caseD_9:
  CVar10 = FieldDescriptor::cpp_string_type(field);
  if ((CVar10 != kView) && (CVar10 != kString)) {
    if (CVar10 != kCord) {
      return;
    }
    VerifyFieldType<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>(this,field);
    this_02 = (RepeatedField<absl::lts_20250127::Cord> *)MutableRawImpl(this,message,field);
    RepeatedField<absl::lts_20250127::Cord>::Clear(this_02);
    return;
  }
  VerifyFieldType<google::protobuf::RepeatedPtrField<std::__cxx11::string>>(this,field);
  pRVar12 = (RepeatedPtrFieldBase *)MutableRawImpl(this,message,field);
  protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>(pRVar12);
  return;
}

Assistant:

void Reflection::ClearField(Message* message,
                            const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE(ClearField, message);
  USAGE_CHECK_MESSAGE_TYPE(ClearField);

  if (field->is_extension()) {
    MutableExtensionSet(message)->ClearExtension(field->number());
  } else if (!field->is_repeated()) {
    if (schema_.InRealOneof(field)) {
      ClearOneofField(message, field);
      return;
    }
    if (HasFieldSingular(*message, field)) {
      ClearHasBit(message, field);

      // We need to set the field back to its default value.
      switch (field->cpp_type()) {
#define CLEAR_TYPE(CPPTYPE, TYPE)                                      \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                             \
    *MutableRaw<TYPE>(message, field) = field->default_value_##TYPE(); \
    break;

        CLEAR_TYPE(INT32, int32_t);
        CLEAR_TYPE(INT64, int64_t);
        CLEAR_TYPE(UINT32, uint32_t);
        CLEAR_TYPE(UINT64, uint64_t);
        CLEAR_TYPE(FLOAT, float);
        CLEAR_TYPE(DOUBLE, double);
        CLEAR_TYPE(BOOL, bool);
#undef CLEAR_TYPE

        case FieldDescriptor::CPPTYPE_ENUM:
          *MutableRaw<int>(message, field) =
              field->default_value_enum()->number();
          break;

        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->cpp_string_type()) {
            case FieldDescriptor::CppStringType::kCord:
              if (field->has_default_value()) {
                *MutableRaw<absl::Cord>(message, field) =
                    field->default_value_string();
              } else {
                MutableRaw<absl::Cord>(message, field)->Clear();
              }
              break;
            case FieldDescriptor::CppStringType::kView:
            case FieldDescriptor::CppStringType::kString:
              if (IsInlined(field)) {
                // Currently, string with default value can't be inlined. So we
                // don't have to handle default value here.
                MutableRaw<InlinedStringField>(message, field)->ClearToEmpty();
              } else if (IsMicroString(field)) {
                if (field->has_default_value()) {
                  // TODO: Use an unowned block instead.
                  MutableRaw<MicroString>(message, field)
                      ->Set(field->default_value_string(), message->GetArena());
                } else {
                  MutableRaw<MicroString>(message, field)->Clear();
                }
              } else {
                auto* str = MutableRaw<ArenaStringPtr>(message, field);
                str->Destroy();
                str->InitDefault();
              }
              break;
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          (*MutableRaw<Message*>(message, field))->Clear();
          break;
      }
    }
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                           \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:                        \
    MutableRaw<RepeatedField<LOWERCASE> >(message, field)->Clear(); \
    break

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING: {
        switch (field->cpp_string_type()) {
          case FieldDescriptor::CppStringType::kCord:
            MutableRaw<RepeatedField<absl::Cord>>(message, field)->Clear();
            break;
          case FieldDescriptor::CppStringType::kView:
          case FieldDescriptor::CppStringType::kString:
            MutableRaw<RepeatedPtrField<std::string> >(message, field)->Clear();
            break;
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message, field)->Clear();
        } else {
          // We don't know which subclass of RepeatedPtrFieldBase the type is,
          // so we use RepeatedPtrFieldBase directly.
          MutableRaw<RepeatedPtrFieldBase>(message, field)
              ->Clear<GenericTypeHandler<Message> >();
        }
        break;
      }
    }
  }
}